

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O2

float mf_predict<sparse_parameters>(gdmf *d,example *ec,sparse_parameters *weights)

{
  v_array<float> *this;
  char cVar1;
  char cVar2;
  char *pcVar3;
  byte *pbVar4;
  sparse_parameters *weights_00;
  example *ec_00;
  vw *pvVar5;
  string *i;
  pointer pbVar6;
  vw_exception *this_00;
  size_t sVar7;
  pointer pbVar8;
  uint64_t k;
  ulong uVar9;
  string *i_1;
  byte *pbVar10;
  float fVar11;
  float extraout_XMM0_Da;
  float local_21c;
  float linear_prediction;
  sparse_parameters *local_208;
  example *local_200;
  vw *local_1f8;
  pointer local_1f0;
  pred_offset x_dot_r;
  string local_1d8;
  pred_offset x_dot_l;
  ostream local_1a8;
  
  local_1f8 = d->all;
  local_21c = (ec->l).simple.initial;
  pbVar8 = (local_1f8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (local_1f8->pairs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar8; pbVar6 = pbVar6 + 1) {
    pcVar3 = (pbVar6->_M_dataplus)._M_p;
    cVar1 = *pcVar3;
    cVar2 = pcVar3[1];
    sVar7 = ec->num_features -
            ((long)(ec->super_example_predict).feature_space[cVar2].values._end -
             (long)(ec->super_example_predict).feature_space[cVar2].values._begin >> 2) *
            ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
             (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2);
    ec->num_features = sVar7;
    cVar1 = *(pbVar6->_M_dataplus)._M_p;
    sVar7 = (ulong)d->rank *
            ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
             (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2) + sVar7;
    ec->num_features = sVar7;
    cVar1 = (pbVar6->_M_dataplus)._M_p[1];
    ec->num_features =
         (ulong)d->rank *
         ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
          (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2) + sVar7;
  }
  this = &d->scalars;
  local_208 = weights;
  v_array<float>::clear(this);
  linear_prediction = 0.0;
  pbVar4 = (ec->super_example_predict).indices._end;
  local_200 = ec;
  for (pbVar10 = (ec->super_example_predict).indices._begin; pbVar10 != pbVar4;
      pbVar10 = pbVar10 + 1) {
    GD::foreach_feature<float,_&GD::vec_add,_sparse_parameters>
              (local_208,(features *)&(ec->super_example_predict).feature_space[*pbVar10].values,
               &linear_prediction,0,1.0);
  }
  v_array<float>::push_back(this,&linear_prediction);
  local_21c = local_21c + linear_prediction;
  pbVar8 = (d->all->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1f0 = pbVar8;
  for (pbVar6 = (d->all->pairs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar5 = local_1f8, ec_00 = local_200,
      pbVar6 != pbVar8; pbVar6 = pbVar6 + 1) {
    pcVar3 = (pbVar6->_M_dataplus)._M_p;
    cVar1 = *pcVar3;
    if (((ec->super_example_predict).feature_space[cVar1].values._end !=
         (ec->super_example_predict).feature_space[cVar1].values._begin) &&
       (cVar1 = pcVar3[1],
       (ec->super_example_predict).feature_space[cVar1].values._end !=
       (ec->super_example_predict).feature_space[cVar1].values._begin)) {
      for (uVar9 = 1; weights_00 = local_208, pbVar8 = local_1f0, uVar9 <= d->rank;
          uVar9 = uVar9 + 1) {
        x_dot_l.p = 0.0;
        x_dot_l.offset = uVar9;
        GD::foreach_feature<pred_offset,_&offset_add,_sparse_parameters>
                  (local_208,
                   (features *)
                   &(ec->super_example_predict).feature_space[*(pbVar6->_M_dataplus)._M_p].values,
                   &x_dot_l,0,1.0);
        x_dot_r.p = 0.0;
        x_dot_r.offset = d->rank + uVar9;
        GD::foreach_feature<pred_offset,_&offset_add,_sparse_parameters>
                  (weights_00,
                   (features *)
                   &(ec->super_example_predict).feature_space[(pbVar6->_M_dataplus)._M_p[1]].values,
                   &x_dot_r,0,1.0);
        local_21c = local_21c + x_dot_l.p * x_dot_r.p;
        v_array<float>::push_back(this,&x_dot_l.p);
        v_array<float>::push_back(this,&x_dot_r.p);
      }
    }
  }
  if ((local_1f8->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_1f8->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::stringstream::stringstream((stringstream *)&x_dot_l);
    std::operator<<(&local_1a8,"cannot use triples in matrix factorization");
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
               ,0x96,&local_1d8);
    __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_200->partial_prediction = local_21c;
  (*local_1f8->set_minmax)(local_1f8->sd,(local_200->l).simple.label);
  fVar11 = GD::finalize_prediction(pvVar5->sd,ec_00->partial_prediction);
  (ec_00->pred).scalar = fVar11;
  fVar11 = (ec_00->l).simple.label;
  if ((fVar11 != 3.4028235e+38) || (NAN(fVar11))) {
    (*pvVar5->loss->_vptr_loss_function[1])(pvVar5->loss,pvVar5->sd);
    ec_00->loss = extraout_XMM0_Da * ec_00->weight;
  }
  if (pvVar5->audit == true) {
    mf_print_audit_features(d,ec_00,0);
  }
  return (ec_00->pred).scalar;
}

Assistant:

float mf_predict(gdmf& d, example& ec, T& weights)
{
  vw& all = *d.all;
  label_data& ld = ec.l.simple;
  float prediction = ld.initial;

  for (string& i : d.all->pairs)
  {
    ec.num_features -= ec.feature_space[(int)i[0]].size() * ec.feature_space[(int)i[1]].size();
    ec.num_features += ec.feature_space[(int)i[0]].size() * d.rank;
    ec.num_features += ec.feature_space[(int)i[1]].size() * d.rank;
  }

  // clear stored predictions
  d.scalars.clear();

  float linear_prediction = 0.;
  // linear terms

  for (features& fs : ec) GD::foreach_feature<float, GD::vec_add, T>(weights, fs, linear_prediction);

  // store constant + linear prediction
  // note: constant is now automatically added
  d.scalars.push_back(linear_prediction);

  prediction += linear_prediction;
  // interaction terms
  for (string& i : d.all->pairs)
  {
    if (ec.feature_space[(int)i[0]].size() > 0 && ec.feature_space[(int)i[1]].size() > 0)
    {
      for (uint64_t k = 1; k <= d.rank; k++)
      {
        // x_l * l^k
        // l^k is from index+1 to index+d.rank
        // float x_dot_l = sd_offset_add(weights, ec.atomics[(int)(*i)[0]].begin(), ec.atomics[(int)(*i)[0]].end(), k);
        pred_offset x_dot_l = {0., k};
        GD::foreach_feature<pred_offset, offset_add, T>(weights, ec.feature_space[(int)i[0]], x_dot_l);
        // x_r * r^k
        // r^k is from index+d.rank+1 to index+2*d.rank
        // float x_dot_r = sd_offset_add(weights, ec.atomics[(int)(*i)[1]].begin(), ec.atomics[(int)(*i)[1]].end(),
        // k+d.rank);
        pred_offset x_dot_r = {0., k + d.rank};
        GD::foreach_feature<pred_offset, offset_add, T>(weights, ec.feature_space[(int)i[1]], x_dot_r);

        prediction += x_dot_l.p * x_dot_r.p;

        // store prediction from interaction terms
        d.scalars.push_back(x_dot_l.p);
        d.scalars.push_back(x_dot_r.p);
      }
    }
  }

  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");

  // d.scalars has linear, x_dot_l_1, x_dot_r_1, x_dot_l_2, x_dot_r_2, ...

  ec.partial_prediction = prediction;

  all.set_minmax(all.sd, ld.label);

  ec.pred.scalar = GD::finalize_prediction(all.sd, ec.partial_prediction);

  if (ld.label != FLT_MAX)
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;

  if (all.audit)
    mf_print_audit_features(d, ec, 0);

  return ec.pred.scalar;
}